

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O2

void __thiscall
cmExternalMakefileProjectGenerator::~cmExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGenerator *this)

{
  this->_vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExternalMakefileProjectGenerator_005e7b38;
  std::__cxx11::string::~string((string *)&this->Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->SupportedGlobalGenerators);
  return;
}

Assistant:

virtual ~cmExternalMakefileProjectGenerator() = default;